

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ns_sock_to_str(sock_t sock,char *buf,size_t len,int flags)

{
  size_t sVar1;
  char *pcVar2;
  socklen_t slen;
  socket_address sa;
  socklen_t local_2c;
  sockaddr local_28;
  
  local_2c = 0x10;
  if (len != 0 && buf != (char *)0x0) {
    *buf = '\0';
    local_28.sa_family = 0;
    local_28.sa_data[0] = '\0';
    local_28.sa_data[1] = '\0';
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    if ((flags & 4U) == 0) {
      getsockname(sock,&local_28,&local_2c);
    }
    else {
      getpeername(sock,&local_28,&local_2c);
    }
    if ((flags & 1U) != 0) {
      inet_ntop((uint)local_28.sa_family,local_28.sa_data + 2,buf,(socklen_t)len);
    }
    if ((flags & 2U) != 0) {
      sVar1 = strlen(buf);
      pcVar2 = ":";
      if ((flags & 1U) == 0) {
        pcVar2 = "";
      }
      snprintf(buf + sVar1,len + ~sVar1,"%s%d",pcVar2,
               (ulong)(ushort)(local_28.sa_data._0_2_ << 8 | (ushort)local_28.sa_data._0_2_ >> 8));
    }
  }
  return;
}

Assistant:

void ns_sock_to_str(sock_t sock, char *buf, size_t len, int flags) {
  union socket_address sa;
  socklen_t slen = sizeof(sa);

  if (buf != NULL && len > 0) {
    buf[0] = '\0';
    memset(&sa, 0, sizeof(sa));
    if (flags & 4) {
      getpeername(sock, &sa.sa, &slen);
    } else {
      getsockname(sock, &sa.sa, &slen);
    }
    if (flags & 1) {
#if defined(NS_ENABLE_IPV6)
      inet_ntop(sa.sa.sa_family, sa.sa.sa_family == AF_INET ?
                (void *) &sa.sin.sin_addr :
                (void *) &sa.sin6.sin6_addr, buf, len);
#elif defined(_WIN32)
      // Only Windoze Vista (and newer) have inet_ntop()
      strncpy(buf, inet_ntoa(sa.sin.sin_addr), len);
#else
      inet_ntop(sa.sa.sa_family, (void *) &sa.sin.sin_addr, buf,(socklen_t)len);
#endif
    }
    if (flags & 2) {
      snprintf(buf + strlen(buf), len - (strlen(buf) + 1), "%s%d",
               flags & 1 ? ":" : "", (int) ntohs(sa.sin.sin_port));
    }
  }
}